

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

sector_t_conflict * __thiscall
sector_t::FindModelCeilingSector(sector_t_conflict *this,double floordestheight)

{
  double dVar1;
  double dVar2;
  double dVar3;
  line_t_conflict *plVar4;
  sector_t_conflict *psVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  if (0 < (long)this->linecount) {
    lVar6 = 0;
    do {
      plVar4 = this->lines[lVar6];
      if ((plVar4->flags & 4) == 0) {
        psVar5 = (sector_t_conflict *)0x0;
      }
      else {
        psVar5 = plVar4->frontsector;
        if (plVar4->frontsector == this) {
          psVar5 = (sector_t_conflict *)0x0;
          if (plVar4->backsector != this) {
            psVar5 = plVar4->backsector;
          }
        }
      }
      if (psVar5 != (sector_t_conflict *)0x0) {
        dVar1 = (psVar5->ceilingplane).D;
        dVar2 = (psVar5->ceilingplane).normal.X;
        dVar3 = (psVar5->ceilingplane).normal.Y;
        dVar7 = (psVar5->ceilingplane).negiC;
        dVar8 = ((plVar4->v1->p).Y * dVar3 + (plVar4->v1->p).X * dVar2 + dVar1) * dVar7;
        if ((dVar8 == floordestheight) && (!NAN(dVar8) && !NAN(floordestheight))) {
          return psVar5;
        }
        dVar7 = dVar7 * (dVar3 * (plVar4->v2->p).Y + dVar1 + dVar2 * (plVar4->v2->p).X);
        if ((dVar7 == floordestheight) && (!NAN(dVar7) && !NAN(floordestheight))) {
          return psVar5;
        }
      }
      lVar6 = lVar6 + 1;
    } while (this->linecount != lVar6);
  }
  return (sector_t_conflict *)0x0;
}

Assistant:

sector_t *sector_t::FindModelCeilingSector (double floordestheight) const
{
	int i;
	sector_t *sec;

	//jff 5/23/98 don't disturb sec->linecount while searching
	// but allow early exit in old demos
	for (i = 0; i < linecount; i++)
	{
		sec = getNextSector (lines[i], this);
		if (sec != NULL &&
			(sec->ceilingplane.ZatPoint(lines[i]->v1) == floordestheight ||
			 sec->ceilingplane.ZatPoint(lines[i]->v2) == floordestheight))
		{
			return sec;
		}
	}
	return NULL;
}